

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImRect *pIVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  short sVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiPtrOrIndex *__src;
  float *__src_00;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImU32 IVar9;
  int iVar10;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiPtrOrIndex *__dest;
  float *__dest_00;
  void *__s;
  ImGuiTableColumn *pIVar11;
  char *__dest_01;
  ImS16 IVar12;
  int iVar13;
  ImRect *pIVar14;
  long lVar15;
  ImGuiContext *g;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ImGuiID id_00;
  ulong uVar19;
  ImGuiTableColumn *pIVar20;
  char *pcVar21;
  ImGuiTableCellData *pIVar22;
  int iVar23;
  uint uVar24;
  ImVec2 IVar25;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  ImRect outer_rect;
  ImRect local_70;
  ImPool<ImGuiTable> *local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined7 uStack_40;
  undefined4 uStack_39;
  undefined4 uStack_35;
  
  pIVar7 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  if (pIVar5->SkipItems != false) {
    return false;
  }
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                  ,0xf6,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                  ,0xf8,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar25 = GetContentRegionAvail();
  fVar29 = IVar25.y;
  auVar28._8_4_ = (int)extraout_XMM0_Qb;
  auVar28._0_4_ = IVar25.x;
  auVar28._4_4_ = IVar25.y;
  auVar28._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  if (IVar25.x <= 1.0) {
    auVar28._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar25 = CalcItemSize(*outer_size,auVar28._0_4_,0.0);
    local_70.Min = (pIVar5->DC).CursorPos;
    local_70.Max.x = IVar25.x + local_70.Min.x;
    local_70.Max.y = IVar25.y + local_70.Min.y;
  }
  else {
    if (fVar29 <= 1.0) {
      fVar29 = 1.0;
    }
    IVar25 = CalcItemSize(*outer_size,auVar28._0_4_,fVar29);
    local_70.Min = (pIVar5->DC).CursorPos;
    local_70.Max.x = IVar25.x + local_70.Min.x;
    local_70.Max.y = IVar25.y + local_70.Min.y;
    bVar8 = IsClippedEx(&local_70,0,false);
    if (bVar8) {
      ItemSize(&local_70,-1.0);
      return false;
    }
  }
  local_60 = &pIVar7->Tables;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(local_60,id);
  iVar10 = pIVar7->FrameCount;
  if (p_00->LastFrameActive == iVar10) {
    sVar4 = p_00->InstanceCurrent;
    IVar12 = sVar4 + 1;
    id_00 = (int)sVar4 + id + 1;
    uVar16 = p_00->Flags;
    if ((-1 < sVar4) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                    ,0x10b,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  else {
    uVar16 = p_00->Flags;
    IVar12 = 0;
    id_00 = id;
  }
  uVar17 = 0;
  if ((flags & 0x6000U) == 0) {
    uVar17 = ((flags & 0x1000000U) >> 0xb) + 0x2000;
  }
  uVar24 = uVar17 | flags & 0xfffbfffeU | 0x40000;
  if (-1 < (short)flags) {
    uVar24 = uVar17 | flags;
  }
  uVar17 = (uVar24 & 1) << 9;
  uVar18 = uVar17 | uVar24;
  uVar17 = uVar17 | uVar24 & 0xfffdffff;
  if ((uVar24 & 0x3000000) == 0) {
    uVar17 = uVar18;
  }
  if ((uVar24 >> 0x11 & 1) == 0) {
    uVar17 = uVar18;
  }
  uVar24 = uVar17 & 0xfffff7ff;
  if ((uVar17 >> 0xc & 1) == 0) {
    uVar24 = uVar17;
  }
  uVar17 = uVar24;
  if ((uVar24 & 0xf) == 0) {
    uVar17 = uVar24 | 0x10;
  }
  if (((uint)pIVar5->RootWindow->Flags >> 8 & 1) != 0) {
    uVar17 = uVar24 | 0x10;
  }
  pIVar1 = &p_00->WorkRect;
  p_00->ID = id;
  p_00->Flags = uVar17;
  p_00->InstanceCurrent = IVar12;
  p_00->LastFrameActive = iVar10;
  p_00->InnerWindow = pIVar5;
  p_00->OuterWindow = pIVar5;
  p_00->ColumnsCount = columns_count;
  p_00->IsLayoutLocked = false;
  p_00->InnerWidth = inner_width;
  (p_00->OuterRect).Min = local_70.Min;
  (p_00->OuterRect).Max = local_70.Max;
  (p_00->WorkRect).Min = local_70.Min;
  (p_00->WorkRect).Max = local_70.Max;
  if ((flags & 0x3000000U) != 0) {
    fVar29 = inner_width;
    if ((uVar17 & 0x1000000) == 0) {
      fVar29 = 3.4028235e+38;
    }
    fVar29 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar29 & -(uint)(0.0 < inner_width));
    if (fVar29 != 3.4028235e+38 || (uVar17 & 0x3000000) == 0x1000000) {
      if ((uVar17 & 0x3000000) == 0x1000000) {
        local_58.y = 1.1754944e-38;
      }
      else {
        local_58.y = 0.0;
      }
      local_58.x = (float)(-(uint)(fVar29 != 3.4028235e+38) & (uint)fVar29);
      SetNextWindowContentSize(&local_58);
    }
    IVar25 = (p_00->OuterRect).Min;
    IVar26 = (p_00->OuterRect).Max;
    local_58.x = IVar26.x - IVar25.x;
    local_58.y = IVar26.y - IVar25.y;
    BeginChildEx(name,id_00,&local_58,false,(uVar17 & 0x1000000) >> 0xd);
    pIVar6 = pIVar7->CurrentWindow;
    p_00->InnerWindow = pIVar6;
    IVar25 = (pIVar6->WorkRect).Max;
    pIVar1->Min = (pIVar6->WorkRect).Min;
    (p_00->WorkRect).Max = IVar25;
    IVar25 = pIVar6->Pos;
    IVar26.x = (pIVar6->Size).x + IVar25.x;
    IVar26.y = (pIVar6->Size).y + IVar25.y;
    (p_00->OuterRect).Min = IVar25;
    (p_00->OuterRect).Max = IVar26;
    if (((((pIVar6->WindowPadding).x != 0.0) || (fVar29 = (pIVar6->WindowPadding).y, fVar29 != 0.0))
        || (NAN(fVar29))) || ((pIVar6->WindowBorderSize != 0.0 || (NAN(pIVar6->WindowBorderSize)))))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                    ,0x135,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(id_00);
  pIVar6 = p_00->InnerWindow;
  p_00->HostIndentX = (pIVar6->DC).Indent.x;
  IVar25 = (pIVar6->ClipRect).Max;
  (p_00->HostClipRect).Min = (pIVar6->ClipRect).Min;
  (p_00->HostClipRect).Max = IVar25;
  p_00->HostSkipItems = pIVar6->SkipItems;
  IVar25 = (pIVar6->WorkRect).Max;
  (p_00->HostBackupWorkRect).Min = (pIVar6->WorkRect).Min;
  (p_00->HostBackupWorkRect).Max = IVar25;
  IVar25 = (pIVar6->ParentWorkRect).Max;
  (p_00->HostBackupParentWorkRect).Min = (pIVar6->ParentWorkRect).Min;
  (p_00->HostBackupParentWorkRect).Max = IVar25;
  (p_00->HostBackupColumnsOffset).x = (pIVar5->DC).ColumnsOffset.x;
  p_00->HostBackupPrevLineSize = (pIVar6->DC).PrevLineSize;
  p_00->HostBackupCurrLineSize = (pIVar6->DC).CurrLineSize;
  p_00->HostBackupCursorMaxPos = (pIVar6->DC).CursorMaxPos;
  p_00->HostBackupItemWidth = (pIVar5->DC).ItemWidth;
  p_00->HostBackupItemWidthStackSize = (pIVar5->DC).ItemWidthStack.Size;
  IVar25 = (p_00->WorkRect).Max;
  (pIVar6->ParentWorkRect).Min = pIVar1->Min;
  (pIVar6->ParentWorkRect).Max = IVar25;
  fVar29 = 0.0;
  fVar31 = 0.0;
  if ((uVar17 >> 9 & 1) != 0) {
    fVar31 = 1.0;
  }
  (pIVar6->DC).CurrLineSize.x = 0.0;
  (pIVar6->DC).CurrLineSize.y = 0.0;
  (pIVar6->DC).PrevLineSize.x = 0.0;
  (pIVar6->DC).PrevLineSize.y = 0.0;
  if ((uVar17 & 0x800200) == 0x200) {
    fVar29 = (pIVar7->Style).CellPadding.x;
LAB_001abdcc:
    fVar30 = 0.0;
  }
  else {
    if ((uVar17 & 0x800200) != 0) goto LAB_001abdcc;
    fVar30 = (pIVar7->Style).CellPadding.x;
  }
  p_00->CellSpacingX1 = fVar31 + fVar30;
  p_00->CellSpacingX2 = fVar30;
  p_00->CellPaddingX = fVar29;
  p_00->CellPaddingY = (pIVar7->Style).CellPadding.y;
  fVar31 = 0.0;
  fVar30 = 0.0;
  if ((uVar17 >> 10 & 1) != 0) {
    fVar30 = 1.0;
  }
  if ((uVar17 >> 0x16 & 1) == 0 && (uVar17 & 0x200400) != 0) {
    fVar31 = (pIVar7->Style).CellPadding.x;
  }
  p_00->OuterPaddingX = (fVar30 + fVar31) - fVar29;
  p_00->CurrentRow = -1;
  p_00->CurrentColumn = -1;
  p_00->RowBgColorCounter = 0;
  *(uint *)&p_00->field_0x90 = (uint)*(ushort *)&p_00->field_0x90;
  pIVar14 = &pIVar6->ClipRect;
  if (pIVar6 == pIVar5) {
    pIVar14 = pIVar1;
  }
  IVar25 = pIVar14->Max;
  (p_00->InnerClipRect).Min = pIVar14->Min;
  (p_00->InnerClipRect).Max = IVar25;
  IVar25 = (p_00->InnerClipRect).Min;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = (p_00->InnerClipRect).Max.x;
  auVar27._4_4_ = (p_00->InnerClipRect).Max.y;
  IVar26 = (p_00->WorkRect).Min;
  fVar30 = IVar26.x;
  fVar32 = IVar26.y;
  auVar33._8_8_ = 0;
  auVar33._0_4_ = (p_00->WorkRect).Max.x;
  auVar33._4_4_ = (p_00->WorkRect).Max.y;
  auVar28 = minps(auVar27,auVar33);
  fVar29 = IVar25.x;
  fVar31 = IVar25.y;
  uVar24 = -(uint)(fVar30 <= fVar29);
  uVar18 = -(uint)(fVar32 <= fVar31);
  (p_00->InnerClipRect).Min =
       (ImVec2)(CONCAT44(~uVar18 & (uint)fVar32,~uVar24 & (uint)fVar30) |
               CONCAT44((uint)fVar31 & uVar18,(uint)fVar29 & uVar24));
  (p_00->InnerClipRect).Max = auVar28._0_8_;
  ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
  if ((uVar17 >> 0x11 & 1) == 0) {
    fVar29 = (pIVar6->ClipRect).Max.y;
  }
  else {
    fVar29 = (p_00->InnerClipRect).Max.y;
    fVar31 = (pIVar6->WorkRect).Max.y;
    if (fVar31 <= fVar29) {
      fVar29 = fVar31;
    }
  }
  (p_00->InnerClipRect).Max.y = fVar29;
  IVar25 = (p_00->InnerClipRect).Max;
  (p_00->BgClipRect).Min = (p_00->InnerClipRect).Min;
  (p_00->BgClipRect).Max = IVar25;
  IVar25 = (p_00->HostClipRect).Max;
  (p_00->BgClipRectForDrawCmd).Min = (p_00->HostClipRect).Min;
  (p_00->BgClipRectForDrawCmd).Max = IVar25;
  if ((p_00->BgClipRect).Max.y < (p_00->BgClipRect).Min.y) {
    __assert_fail("table->BgClipRect.Min.y <= table->BgClipRect.Max.y",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_tables.cpp"
                  ,0x16c,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  fVar29 = (p_00->WorkRect).Min.y;
  p_00->RowPosY2 = fVar29;
  p_00->RowPosY1 = fVar29;
  p_00->RowTextBaseline = 0.0;
  p_00->FreezeRowsRequest = '\0';
  p_00->FreezeRowsCount = '\0';
  p_00->FreezeColumnsRequest = '\0';
  p_00->FreezeColumnsCount = '\0';
  p_00->IsUnfrozen = true;
  p_00->DeclColumnsCount = '\0';
  p_00->RightMostEnabledColumn = -1;
  IVar9 = GetColorU32(0x2b,1.0);
  p_00->BorderColorStrong = IVar9;
  IVar9 = GetColorU32(0x2c,1.0);
  p_00->BorderColorLight = IVar9;
  fVar29 = (p_00->InnerClipRect).Max.x;
  p_00->BorderX1 = (p_00->InnerClipRect).Min.x;
  p_00->BorderX2 = fVar29;
  uVar24 = ImPool<ImGuiTable>::GetIndex(local_60,p_00);
  iVar10 = (pIVar7->CurrentTableStack).Size;
  if (iVar10 == (pIVar7->CurrentTableStack).Capacity) {
    if (iVar10 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar10 / 2 + iVar10;
    }
    iVar23 = iVar10 + 1;
    if (iVar10 + 1 < iVar13) {
      iVar23 = iVar13;
    }
    __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar23 << 4);
    __src = (pIVar7->CurrentTableStack).Data;
    if (__src != (ImGuiPtrOrIndex *)0x0) {
      memcpy(__dest,__src,(long)(pIVar7->CurrentTableStack).Size << 4);
      MemFree((pIVar7->CurrentTableStack).Data);
    }
    (pIVar7->CurrentTableStack).Data = __dest;
    (pIVar7->CurrentTableStack).Capacity = iVar23;
    iVar10 = (pIVar7->CurrentTableStack).Size;
  }
  else {
    __dest = (pIVar7->CurrentTableStack).Data;
  }
  __dest[iVar10].Ptr = (void *)0x0;
  __dest[iVar10].Index = uVar24;
  (pIVar7->CurrentTableStack).Size = (pIVar7->CurrentTableStack).Size + 1;
  pIVar7->CurrentTable = p_00;
  (pIVar5->DC).CurrentTableIdx = uVar24;
  if (pIVar6 != pIVar5) {
    (pIVar6->DC).CurrentTableIdx = uVar24;
  }
  if (((uVar16 & 2) != 0) && ((uVar17 & 2) == 0)) {
    p_00->IsResetDisplayOrderRequest = true;
  }
  iVar10 = (pIVar7->TablesLastTimeActive).Size;
  if (iVar10 <= (int)uVar24) {
    iVar13 = uVar24 + 1;
    iVar23 = (pIVar7->TablesLastTimeActive).Capacity;
    if (iVar23 <= (int)uVar24) {
      if (iVar23 == 0) {
        iVar23 = 8;
      }
      else {
        iVar23 = iVar23 / 2 + iVar23;
      }
      if (iVar23 <= iVar13) {
        iVar23 = iVar13;
      }
      __dest_00 = (float *)MemAlloc((long)iVar23 << 2);
      __src_00 = (pIVar7->TablesLastTimeActive).Data;
      if (__src_00 != (float *)0x0) {
        memcpy(__dest_00,__src_00,(long)(pIVar7->TablesLastTimeActive).Size << 2);
        MemFree((pIVar7->TablesLastTimeActive).Data);
      }
      (pIVar7->TablesLastTimeActive).Data = __dest_00;
      (pIVar7->TablesLastTimeActive).Capacity = iVar23;
      iVar10 = (pIVar7->TablesLastTimeActive).Size;
    }
    if (iVar10 <= (int)uVar24) {
      lVar15 = (long)iVar10;
      do {
        (pIVar7->TablesLastTimeActive).Data[lVar15] = -1.0;
        lVar15 = lVar15 + 1;
      } while (iVar13 != lVar15);
    }
    (pIVar7->TablesLastTimeActive).Size = iVar13;
    iVar10 = iVar13;
  }
  if (((int)uVar24 < 0) || (iVar10 <= (int)uVar24)) {
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                  ,0x644,"T &ImVector<float>::operator[](int) [T = float]");
  }
  (pIVar7->TablesLastTimeActive).Data[uVar24] = (float)pIVar7->Time;
  p_00->MemoryCompacted = false;
  iVar10 = (int)((ulong)((long)(p_00->Columns).DataEnd - (long)(p_00->Columns).Data) >> 3) *
           -0x3b13b13b;
  if (iVar10 == columns_count || iVar10 == 0) {
    if (p_00->RawData == (void *)0x0) goto LAB_001ac1e0;
  }
  else {
    MemFree(p_00->RawData);
    p_00->RawData = (void *)0x0;
LAB_001ac1e0:
    uVar19 = (ulong)(uint)(columns_count * 0x71);
    __s = MemAlloc(uVar19);
    p_00->RawData = __s;
    memset(__s,0,uVar19);
    pIVar11 = (ImGuiTableColumn *)p_00->RawData;
    pIVar20 = (ImGuiTableColumn *)
              ((long)&(pIVar11->ClipRect).Min.x + (ulong)(uint)(columns_count * 0x68));
    (p_00->Columns).Data = pIVar11;
    (p_00->Columns).DataEnd = pIVar20;
    pIVar22 = (ImGuiTableCellData *)
              ((long)&(pIVar11->ClipRect).Min.x + (ulong)(uint)(columns_count * 0x69));
    (p_00->DisplayOrderToIndex).Data = (char *)pIVar20;
    (p_00->DisplayOrderToIndex).DataEnd = (char *)pIVar22;
    (p_00->RowCellData).Data = pIVar22;
    (p_00->RowCellData).DataEnd = (ImGuiTableCellData *)((long)&(pIVar11->ClipRect).Min.x + uVar19);
    p_00->IsSettingsRequestLoad = true;
    p_00->IsInitializing = true;
  }
  if (p_00->IsResetAllRequest == true) {
    p_00->IsInitializing = true;
    p_00->IsResetAllRequest = false;
    p_00->IsSettingsRequestLoad = false;
    p_00->IsSettingsDirty = true;
    p_00->SettingsLoadedFlags = 0;
  }
  else if ((p_00->IsInitializing & 1U) == 0) goto LAB_001ac394;
  p_00->SettingsOffset = -1;
  p_00->IsSortSpecsDirty = true;
  p_00->InstanceInteracted = -1;
  p_00->ContextPopupColumn = -1;
  p_00->ReorderColumn = -1;
  p_00->HoveredColumnBody = -1;
  p_00->HoveredColumnBorder = -1;
  p_00->AutoFitSingleStretchColumn = -1;
  p_00->ResizedColumn = -1;
  p_00->LastResizedColumn = -1;
  if (0 < columns_count) {
    lVar15 = 0x60;
    uVar19 = 0;
    do {
      pIVar11 = (p_00->Columns).Data;
      pIVar20 = (ImGuiTableColumn *)((long)pIVar11 + lVar15 + -0x60);
      if ((p_00->Columns).DataEnd <= pIVar20) goto LAB_001ac48a;
      uVar3 = *(undefined4 *)((long)pIVar11 + lVar15 + -0x38);
      local_48 = 0;
      uStack_40 = 0;
      local_58.x = 0.0;
      local_58.y = 0.0;
      uStack_50 = 0;
      uStack_39 = 0xffffff00;
      uStack_35 = 0xffffffff;
      *(undefined4 *)((long)pIVar11 + lVar15 + -0x40) = 0;
      *(undefined8 *)((long)pIVar11 + lVar15 + -0x50) = 0;
      *(undefined8 *)((long)pIVar11 + lVar15 + -0x48) = 0;
      (pIVar20->ClipRect).Min.x = 0.0;
      (pIVar20->ClipRect).Min.y = 0.0;
      *(undefined8 *)((long)pIVar11 + lVar15 + -0x58) = 0;
      *(undefined4 *)((long)pIVar11 + lVar15 + -0x3c) = 0xbf800000;
      *(undefined4 *)((long)pIVar11 + lVar15 + -0x34) = 0xbf800000;
      puVar2 = (undefined8 *)((long)pIVar11 + lVar15 + -0x30);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)pIVar11 + lVar15 + -0x20);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)pIVar11 + lVar15 + -0x11) = 0xffffffffffffff00;
      *(undefined2 *)((long)pIVar11 + lVar15 + -9) = 0xffff;
      *(undefined1 *)((long)pIVar11 + lVar15 + -7) = 0xff;
      *(undefined4 *)((long)&(pIVar11->ClipRect).Min.x + lVar15 + 2) = 0;
      *(undefined8 *)((long)pIVar11 + lVar15 + -6) = 0;
      *(undefined4 *)((long)pIVar11 + lVar15 + -0x38) = uVar3;
      *(undefined1 *)((long)&(pIVar11->ClipRect).Min.x + lVar15) = 1;
      pcVar21 = (p_00->DisplayOrderToIndex).Data + uVar19;
      if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar21) {
        pcVar21 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
        goto LAB_001ac4b6;
      }
      *pcVar21 = (char)uVar19;
      *(char *)((long)pIVar11 + lVar15 + -0xe) = (char)uVar19;
      *(undefined2 *)((long)pIVar11 + lVar15 + -6) = 0x101;
      uVar19 = uVar19 + 1;
      lVar15 = lVar15 + 0x68;
    } while ((uint)columns_count != uVar19);
  }
LAB_001ac394:
  if (p_00->IsSettingsRequestLoad == true) {
    TableLoadSettings(p_00);
  }
  fVar29 = pIVar7->FontSize;
  fVar31 = p_00->RefScale;
  if ((fVar31 != 0.0) || (NAN(fVar31))) {
    if (((fVar31 != fVar29) || (NAN(fVar31) || NAN(fVar29))) && (0 < columns_count)) {
      pIVar11 = (p_00->Columns).Data;
      uVar19 = (ulong)(uint)columns_count;
      do {
        if ((p_00->Columns).DataEnd <= pIVar11) {
LAB_001ac48a:
          pcVar21 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_001ac4b6:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                        ,0x20b,pcVar21);
        }
        pIVar11->WidthRequest = pIVar11->WidthRequest * (fVar29 / fVar31);
        pIVar11 = pIVar11 + 1;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
    }
  }
  p_00->RefScale = fVar29;
  pIVar6->SkipItems = true;
  if (0 < (p_00->ColumnsNames).Buf.Size) {
    if ((p_00->ColumnsNames).Buf.Capacity < 0) {
      __dest_01 = (char *)MemAlloc(0);
      pcVar21 = (p_00->ColumnsNames).Buf.Data;
      if (pcVar21 != (char *)0x0) {
        memcpy(__dest_01,pcVar21,(long)(p_00->ColumnsNames).Buf.Size);
        MemFree((p_00->ColumnsNames).Buf.Data);
      }
      (p_00->ColumnsNames).Buf.Data = __dest_01;
      (p_00->ColumnsNames).Buf.Capacity = 0;
    }
    (p_00->ColumnsNames).Buf.Size = 0;
  }
  TableBeginApplyRequests(p_00);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Fix flags
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->OuterRect = outer_rect;
    table->WorkRect = outer_rect;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, table->OuterRect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostBackupWorkRect = inner_window->WorkRect;
    table->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    table->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    table->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    table->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    table->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    table->HostBackupItemWidth = outer_window->DC.ItemWidth;
    table->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->ParentWorkRect = table->WorkRect;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // This is because all our cell highlight are manually clipped with BgClipRect
    // Larger at first, if/after unfreezing will become same as tight
    table->BgClipRect = table->InnerClipRect;
    table->BgClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozen = true;
    table->DeclColumnsCount = 0;
    table->RightMostEnabledColumn = -1;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // Make table current
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(table_idx));
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
    {
        IM_FREE(table->RawData);
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleStretchColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            float width_auto = column->WidthAuto;
            *column = ImGuiTableColumn();
            column->WidthAuto = width_auto;
            column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
            column->IsEnabled = column->IsEnabledNextFrame = true;
        }
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}